

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdMicroAllocator.cpp
# Opt level: O3

void __thiscall HACD::MyHeapManager::heap_malloc(MyHeapManager *this)

{
  ulong in_RSI;
  
  if (in_RSI < 0x101) {
    (**(code **)*(this->super_HeapManager)._vptr_HeapManager)();
    return;
  }
  malloc(in_RSI);
  return;
}

Assistant:

virtual void * heap_malloc(size_t size)
  {
    void *ret;

    if ( size <= 256 ) // micro allocator only handles allocations between 0 and 256 bytes in length.
    {
        ret = mMicro->malloc(size);
    }
    else
    {
        ret = ::malloc(size);
    }
    return ret;
  }